

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O0

string * __thiscall antlr::Token::toString_abi_cxx11_(Token *this)

{
  long *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_90 [32];
  string local_70 [20];
  int in_stack_ffffffffffffffa4;
  string *in_stack_ffffffffffffffa8;
  string local_50 [32];
  string local_30 [48];
  
  __lhs = in_RDI;
  (**(code **)(*in_RSI + 0x20))();
  std::operator+((char *)__lhs,in_RDI);
  std::operator+(__lhs,(char *)in_RDI);
  antlr::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4);
  std::operator+(__lhs,(char *)in_RDI);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_90);
  return __lhs;
}

Assistant:

string Token::toString() const
{
	return "[\""+getText()+"\",<"+type+">]";
}